

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

bool __thiscall nite::Texture::load(Texture *this,string *path,Color *transparency)

{
  pointer *pppTVar1;
  uchar *puVar2;
  Color *pCVar3;
  pointer __n;
  iterator iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer ptVar8;
  Color *pCVar9;
  bool bVar10;
  int iVar11;
  pointer ptVar12;
  ulong uVar13;
  uchar *img_data;
  long *plVar14;
  undefined8 *puVar15;
  size_t in_RCX;
  ulong *puVar16;
  Texture *pTVar17;
  uint uVar18;
  size_type *psVar19;
  undefined8 uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  Color *tr;
  bool *pbVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [16];
  undefined1 local_168 [120];
  string local_f0;
  pointer local_d0;
  undefined1 local_c8 [8];
  string fileHash;
  ulong local_98;
  long lStack_90;
  Color *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Texture *local_60;
  string *local_58;
  long local_50;
  pointer local_48;
  int local_3c;
  int local_38;
  int Channels;
  int Width;
  int Height;
  
  bVar10 = fileExists(path);
  if (!bVar10) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "fail to load texture \'",path);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_c8);
    psVar19 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar19) {
      local_168._0_8_ = *psVar19;
      local_168._8_8_ = plVar14[3];
      local_178._0_8_ = local_168;
    }
    else {
      local_168._0_8_ = *psVar19;
      local_178._0_8_ = (size_type *)*plVar14;
    }
    local_178._8_8_ = plVar14[1];
    *plVar14 = (long)psVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    print((string *)local_178);
    if ((undefined1 *)local_178._0_8_ != local_168) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_c8 != (undefined1  [8])&fileHash._M_string_length) {
      operator_delete((void *)local_c8);
    }
    return false;
  }
  local_88 = transparency;
  unload(this);
  hashMemory_abi_cxx11_
            ((string *)local_c8,(nite *)(path->_M_dataplus)._M_p,(char *)path->_M_string_length,
             in_RCX);
  ptVar8 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar18 = 0xffffffff;
  lVar21 = (long)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                 super__Vector_impl_data._M_start;
  ptVar12 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (lVar21 != 0) {
    local_48 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
               super__Vector_impl_data._M_finish;
    lVar22 = (lVar21 >> 3) * -0xf0f0f0f0f0f0f0f;
    local_d0 = (pointer)local_c8;
    psVar19 = &((textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                 super__Vector_impl_data._M_start)->Hash)._M_string_length;
    lVar24 = 0;
    local_60 = this;
    local_58 = path;
    local_50 = lVar21;
    do {
      if (((*(char *)((long)psVar19 + -0xc) == '\0') &&
          (__n = (pointer)*psVar19, __n == fileHash._M_dataplus._M_p)) &&
         ((__n == (pointer)0x0 ||
          (iVar11 = bcmp((((string *)(psVar19 + -1))->_M_dataplus)._M_p,local_d0,(size_t)__n),
          iVar11 == 0)))) {
        uVar18 = (uint)lVar24;
        ptVar12 = local_48;
        lVar21 = local_50;
        path = local_58;
        this = local_60;
        goto LAB_0019704f;
      }
      lVar24 = lVar24 + 1;
      psVar19 = psVar19 + 0x11;
    } while (lVar22 + (ulong)(lVar22 == 0) != lVar24);
    uVar18 = 0xffffffff;
    ptVar12 = local_48;
    lVar21 = local_50;
    path = local_58;
    this = local_60;
  }
LAB_0019704f:
  this->objectId = uVar18;
  local_178._0_8_ = this;
  if (-1 < (int)uVar18) {
    iVar4._M_current =
         ptVar8[uVar18].owners.super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        ptVar8[uVar18].owners.super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nite::Texture*,std::allocator<nite::Texture*>>::_M_realloc_insert<nite::Texture*>
                ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)&ptVar8[uVar18].owners,
                 iVar4,(Texture **)local_178);
    }
    else {
      *iVar4._M_current = this;
      pppTVar1 = &ptVar8[uVar18].owners.
                  super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    Rect::set(&this->region,0.0,0.0,
              (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                     super__Vector_impl_data._M_start[this->objectId].Width,
              (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                     super__Vector_impl_data._M_start[this->objectId].Height);
    bVar10 = false;
    goto LAB_001976d4;
  }
  uVar23 = (lVar21 >> 3) * -0xf0f0f0f0f0f0f0f;
  if (ptVar12 == ptVar8) {
LAB_00197123:
    textureT::textureT((textureT *)local_178);
    std::vector<textureT,_std::allocator<textureT>_>::emplace_back<textureT>
              (&textureList,(textureT *)local_178);
    textureT::~textureT((textureT *)local_178);
    iVar11 = (int)uVar23;
  }
  else {
    if (ptVar8->empty == false) {
      pbVar25 = &ptVar8[1].empty;
      uVar13 = 0;
      do {
        if ((uVar23 + (uVar23 == 0)) - 1 == uVar13) goto LAB_00197123;
        uVar13 = uVar13 + 1;
        bVar10 = *pbVar25;
        pbVar25 = pbVar25 + 0x88;
      } while (bVar10 == false);
      bVar10 = uVar13 <= uVar23 && uVar23 - uVar13 != 0;
    }
    else {
      bVar10 = true;
      uVar13 = 0;
    }
    iVar11 = (int)uVar13;
    if (!bVar10) goto LAB_00197123;
  }
  this->objectId = iVar11;
  ptVar8 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
           super__Vector_impl_data._M_start;
  textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
  super__Vector_impl_data._M_start[iVar11].empty = false;
  iVar4._M_current =
       ptVar8[iVar11].owners.super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      ptVar8[iVar11].owners.super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<nite::Texture*,std::allocator<nite::Texture*>>::_M_realloc_insert<nite::Texture*>
              ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)&ptVar8[iVar11].owners,iVar4
               ,(Texture **)local_178);
  }
  else {
    *iVar4._M_current = this;
    pppTVar1 = &ptVar8[iVar11].owners.
                super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  pCVar9 = local_88;
  std::__cxx11::string::_M_assign
            ((string *)
             &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
              super__Vector_impl_data._M_start[this->objectId].Hash);
  std::__cxx11::string::_M_assign
            ((string *)
             &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
              super__Vector_impl_data._M_start[this->objectId].filename);
  img_data = SOIL_load_image((path->_M_dataplus)._M_p,&local_38,&Channels,&local_3c,0);
  bVar10 = img_data != (uchar *)0x0;
  if (img_data == (uchar *)0x0) {
    std::operator+(&local_80,"failed to load texture \'",path);
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
    pTVar17 = (Texture *)(puVar15 + 2);
    if ((Texture *)*puVar15 == pTVar17) {
      local_168._0_8_ = (pTVar17->filename)._M_dataplus._M_p;
      local_168._8_8_ = puVar15[3];
      local_178._0_8_ = (Texture *)local_168;
    }
    else {
      local_168._0_8_ = (pTVar17->filename)._M_dataplus._M_p;
      local_178._0_8_ = (Texture *)*puVar15;
    }
    local_178._8_8_ = puVar15[1];
    *puVar15 = pTVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    print((string *)local_178);
    if ((Texture *)local_178._0_8_ != (Texture *)local_168) {
      operator_delete((void *)local_178._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    goto LAB_001976d4;
  }
  if (((pCVar9->a != -1.0) || (NAN(pCVar9->a))) && (0 < Channels * local_38 * local_3c)) {
    lVar21 = 0;
    do {
      fVar5 = pCVar9->r * 255.0;
      if ((fVar5 == (float)img_data[lVar21]) && (!NAN(fVar5) && !NAN((float)img_data[lVar21]))) {
        fVar5 = pCVar9->g * 255.0;
        if ((fVar5 == (float)img_data[lVar21 + 1]) &&
           (!NAN(fVar5) && !NAN((float)img_data[lVar21 + 1]))) {
          fVar5 = pCVar9->b * 255.0;
          if ((fVar5 == (float)img_data[lVar21 + 2]) &&
             (!NAN(fVar5) && !NAN((float)img_data[lVar21 + 2]))) {
            puVar2 = img_data + lVar21;
            puVar2[0] = '\0';
            puVar2[1] = '\0';
            puVar2[2] = '\0';
            puVar2[3] = '\0';
          }
        }
      }
      lVar21 = lVar21 + 4;
    } while (lVar21 < (long)local_3c * (long)Channels * (long)local_38);
  }
  glEnable(0xde1);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameterf(0x47012f00,0xde1,0x2802);
  glTexParameterf(0x47012f00,0xde1,0x2803);
  glGenTextures(1,textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                  super__Vector_impl_data._M_start + this->objectId);
  glBindTexture(0xde1,textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                      super__Vector_impl_data._M_start[this->objectId].texture);
  glTexImage2D(0xde1,0,0x1908,local_38,Channels,0,0x1908,0x1401,img_data);
  glBindTexture(0xde1,0);
  glDisable(0xde1);
  ptVar8 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar11 = this->objectId;
  textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
  super__Vector_impl_data._M_start[iVar11].id = iVar11;
  ptVar8[iVar11].Width = local_38;
  ptVar8[iVar11].Height = Channels;
  ptVar8[iVar11].Channels = local_3c;
  fVar5 = pCVar9->g;
  fVar6 = pCVar9->b;
  fVar7 = pCVar9->a;
  pCVar3 = &ptVar8[iVar11].transparency;
  pCVar3->r = pCVar9->r;
  pCVar3->g = fVar5;
  pCVar3->b = fVar6;
  pCVar3->a = fVar7;
  std::__cxx11::string::_M_assign((string *)this);
  Rect::set(&this->region,0.0,0.0,(float)local_38,(float)Channels);
  std::operator+(&local_198,"loaded texture \'",path);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar16 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar16) {
    local_98 = *puVar16;
    lStack_90 = plVar14[3];
    fileHash.field_2._8_8_ = &local_98;
  }
  else {
    local_98 = *puVar16;
    fileHash.field_2._8_8_ = (ulong *)*plVar14;
  }
  lVar21 = plVar14[1];
  *plVar14 = (long)puVar16;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  toStr_abi_cxx11_(&local_f0,(nite *)(ulong)(uint)this->objectId,(int)lVar21);
  uVar23 = local_f0._M_string_length + lVar21;
  uVar13 = 0xf;
  if ((ulong *)fileHash.field_2._8_8_ != &local_98) {
    uVar13 = local_98;
  }
  if (uVar13 < uVar23) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar20 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < uVar23) goto LAB_00197550;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,fileHash.field_2._8_8_);
  }
  else {
LAB_00197550:
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append
                        (fileHash.field_2._M_local_buf + 8,(ulong)local_f0._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  psVar19 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_80.field_2._M_allocated_capacity = *psVar19;
    local_80.field_2._8_8_ = puVar15[3];
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar19;
    local_80._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_80._M_string_length = puVar15[1];
  *puVar15 = psVar19;
  puVar15[1] = 0;
  *(undefined1 *)psVar19 = 0;
  puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
  pTVar17 = (Texture *)(puVar15 + 2);
  if ((Texture *)*puVar15 == pTVar17) {
    local_168._0_8_ = (pTVar17->filename)._M_dataplus._M_p;
    local_168._8_8_ = puVar15[3];
    local_178._0_8_ = (Texture *)local_168;
  }
  else {
    local_168._0_8_ = (pTVar17->filename)._M_dataplus._M_p;
    local_178._0_8_ = (Texture *)*puVar15;
  }
  local_178._8_8_ = puVar15[1];
  *puVar15 = pTVar17;
  puVar15[1] = 0;
  *(undefined1 *)(puVar15 + 2) = 0;
  print((string *)local_178);
  if ((Texture *)local_178._0_8_ != (Texture *)local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((ulong *)fileHash.field_2._8_8_ != &local_98) {
    operator_delete((void *)fileHash.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  SOIL_free_image_data(img_data);
LAB_001976d4:
  if (local_c8 != (undefined1  [8])&fileHash._M_string_length) {
    operator_delete((void *)local_c8);
  }
  return bVar10;
}

Assistant:

bool nite::Texture::load(const String &path, const nite::Color &transparency){
	if(!nite::fileExists(path)){
		nite::print("fail to load texture '"+path+"': it doesn't exist");
		return false;
	}
	unload();
	String fileHash = nite::hashMemory((char*)path.c_str(), path.length());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		textureList[objectId].empty = 0;
		textureList[objectId].owners.push_back(this);
		textureList[objectId].Hash = fileHash;
    	textureList[objectId].filename = path;
	}else{
		textureList[objectId].owners.push_back(this);
		region.set(0, 0, textureList[objectId].Width, textureList[objectId].Height);
		return false;
	}

	int Width;
	int Height;
	int Channels;
	GLubyte *Pixels = SOIL_load_image(path.c_str(), &Width, &Height, &Channels, SOIL_LOAD_AUTO);
	if (Pixels == NULL){
		nite::print("failed to load texture '"+path+"': unsupported format");
		return false;
	}
	if(transparency.a != -1.0){
		for(int i = 0; i < Width * Height * Channels; i += 4){
			const nite::Color &tr = transparency;
			#define uchar unsigned char
			uchar &r = Pixels[i];
			uchar &g = Pixels[i + 1];
			uchar &b = Pixels[i + 2];
			uchar &a = Pixels[i + 3];
			if(r == (tr.r * 255.0) && g == (tr.g * 255.0) && b == (tr.b * 255.0)){
				r = 0; g = 0;	b = 0; a = 0;
			}
		}
	}
	glEnable(GL_TEXTURE_2D);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	glGenTextures(1, &textureList[objectId].texture);
	glBindTexture(GL_TEXTURE_2D, textureList[objectId].texture);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, Width, Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, Pixels);
	glBindTexture(GL_TEXTURE_2D, 0);
	glDisable(GL_TEXTURE_2D);
	textureList[objectId].id = objectId;
	textureList[objectId].Width	= Width;
	textureList[objectId].Height = Height;
	textureList[objectId].Channels = Channels;
	textureList[objectId].transparency = transparency;
	this->filename = path;
	region.set(0, 0, Width, Height);
	nite::print("loaded texture '"+path+"'("+nite::toStr(objectId)+")");
	SOIL_free_image_data(Pixels);
	return true;
}